

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::ReturnValueVerifier::
     verifyRecursive<float>
               (AtomicOperation operation,int index,float valueSoFar,bool (*argsUsed) [5],
               float (*args) [5],float (*returnValues) [5])

{
  bool bVar1;
  int i;
  long lVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  
  bVar3 = true;
  if (index < 5) {
    for (lVar2 = 0; bVar3 = lVar2 != 5, bVar3; lVar2 = lVar2 + 1) {
      if ((*argsUsed)[lVar2] == false) {
        fVar5 = (*returnValues)[lVar2] - valueSoFar;
        fVar4 = -fVar5;
        if (-fVar5 <= fVar5) {
          fVar4 = fVar5;
        }
        if (fVar4 <= 0.01) {
          (*argsUsed)[lVar2] = true;
          if (operation == ATOMIC_OPERATION_EXCHANGE) {
            fVar4 = (*args)[lVar2];
          }
          else {
            fVar4 = -1.0;
          }
          bVar1 = verifyRecursive<float>(operation,index + 1,fVar4,argsUsed,args,returnValues);
          if (bVar1) {
            return bVar3;
          }
          (*argsUsed)[lVar2] = false;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

static bool verifyRecursive (AtomicOperation operation, int index, T valueSoFar, bool (&argsUsed)[NUM_INVOCATIONS_PER_PIXEL], const T (&args)[NUM_INVOCATIONS_PER_PIXEL], const T (&returnValues)[NUM_INVOCATIONS_PER_PIXEL])
	{
		if (index < NUM_INVOCATIONS_PER_PIXEL)
		{
			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				if (!argsUsed[i] && compare(returnValues[i], valueSoFar))
				{
					argsUsed[i] = true;
					if (verifyRecursive(operation, index+1, computeBinaryAtomicOperationResult(operation, valueSoFar, args[i]), argsUsed, args, returnValues))
						return true;
					argsUsed[i] = false;
				}
			}

			return false;
		}
		else
			return true;
	}